

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O3

void __thiscall
deqp::gls::AttributePack::render
          (AttributePack *this,Primitive primitive,DrawMethod drawMethod,int firstVertex,
          int vertexCount,IndexType indexType,void *indexOffset,int rangeStart,int rangeEnd,
          int instanceCount,int indirectOffset,int baseVertex,float coordScale,float colorScale,
          AttributeArray *indexArray)

{
  ostringstream *poVar1;
  InputType IVar2;
  byte bVar3;
  deUint32 dVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  void *pvVar8;
  _func_int **pp_Var9;
  pointer ppAVar10;
  int iVar11;
  pointer ppAVar12;
  ulong uVar13;
  AttributeArray *pAVar14;
  char *pcVar15;
  Context *pCVar16;
  long lVar17;
  stringstream attribName;
  char *in_stack_fffffffffffffde8;
  undefined4 uVar18;
  long *local_1e0;
  long local_1d0 [2];
  DrawMethod local_1bc;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1bc = drawMethod;
  (*this->m_ctx->_vptr_Context[5])
            (this->m_ctx,0,0,(ulong)(uint)(this->m_screen).m_width,
             (ulong)(uint)(this->m_screen).m_height);
  (*this->m_ctx->_vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*this->m_ctx->_vptr_Context[0x2d])(this->m_ctx,0x4000);
  (*this->m_ctx->_vptr_Context[0x76])(this->m_ctx,(ulong)this->m_programID);
  dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
  glu::checkError(dVar4,"glUseProgram()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                  ,0x78f);
  pCVar16 = this->m_ctx;
  uVar5 = (*pCVar16->_vptr_Context[0x66])(pCVar16,(ulong)this->m_programID,"u_coordScale");
  (*pCVar16->_vptr_Context[0x5a])(coordScale,pCVar16,(ulong)uVar5);
  pCVar16 = this->m_ctx;
  uVar5 = (*pCVar16->_vptr_Context[0x66])(pCVar16,(ulong)this->m_programID,"u_colorScale");
  (*pCVar16->_vptr_Context[0x5a])(colorScale,pCVar16,(ulong)uVar5);
  if (this->m_useVao == true) {
    (*this->m_ctx->_vptr_Context[0x4b])(this->m_ctx,(ulong)this->m_vaoID);
  }
  if ((indexArray != (AttributeArray *)0x0) && (indexArray->m_storage == STORAGE_BUFFER)) {
    (*indexArray->m_ctx->_vptr_Context[0x25])
              (indexArray->m_ctx,0x8893,(ulong)indexArray->m_glBuffer);
  }
  uVar18 = (undefined4)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  if (0 < (int)((ulong)((long)(this->m_arrays).
                              super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_arrays).
                             super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar17 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"a_",2);
      std::ostream::operator<<((ostream *)local_1a8,(int)lVar17);
      pCVar16 = this->m_ctx;
      uVar5 = this->m_programID;
      std::__cxx11::stringbuf::str();
      uVar5 = (*pCVar16->_vptr_Context[0x59])(pCVar16,(ulong)uVar5,local_1e0);
      if (local_1e0 != local_1d0) {
        operator_delete(local_1e0,local_1d0[0] + 1);
      }
      pAVar14 = (this->m_arrays).
                super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar17];
      bVar3 = pAVar14->m_bound;
      if ((bool)bVar3 == true) {
        (*this->m_ctx->_vptr_Context[0x50])(this->m_ctx,(ulong)uVar5);
        dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
        glu::checkError(dVar4,"glEnableVertexAttribArray()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                        ,0x7a4);
        pAVar14 = (this->m_arrays).
                  super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar17];
        bVar3 = pAVar14->m_bound;
      }
      if ((bVar3 & 1) == 0) {
        IVar2 = pAVar14->m_inputType;
        if (IVar2 == INPUTTYPE_UNSIGNED_INT) {
          lVar7 = 0x2c0;
LAB_0186b339:
          (**(code **)((long)pAVar14->m_ctx->_vptr_Context + lVar7))
                    (pAVar14->m_ctx,uVar5,(pAVar14->m_defaultAttrib).v.uData[0],
                     (pAVar14->m_defaultAttrib).v.uData[1],(pAVar14->m_defaultAttrib).v.uData[2]);
        }
        else {
          if (IVar2 == INPUTTYPE_INT) {
            lVar7 = 0x2b8;
            goto LAB_0186b339;
          }
          if ((IVar2 == INPUTTYPE_FLOAT) && (pAVar14->m_componentCount - 1U < 4)) {
            switch(pAVar14->m_componentCount) {
            case 1:
              (*pAVar14->m_ctx->_vptr_Context[0x53])(pAVar14->m_ctx,(ulong)uVar5);
              break;
            case 2:
              (*pAVar14->m_ctx->_vptr_Context[0x54])(pAVar14->m_ctx,(ulong)uVar5);
              break;
            case 3:
              (*pAVar14->m_ctx->_vptr_Context[0x55])(pAVar14->m_ctx,(ulong)uVar5);
              break;
            case 4:
              (*pAVar14->m_ctx->_vptr_Context[0x56])
                        ((pAVar14->m_defaultAttrib).v.uData[0],(pAVar14->m_defaultAttrib).v.uData[1]
                         ,(pAVar14->m_defaultAttrib).v.uData[2],
                         (pAVar14->m_defaultAttrib).v.uData[3],pAVar14->m_ctx,(ulong)uVar5);
            }
          }
        }
      }
      else {
        if (pAVar14->m_storage == STORAGE_USER) {
          (*pAVar14->m_ctx->_vptr_Context[0x25])
                    (pAVar14->m_ctx,(ulong)ContextArray::targetToGL::targets[(int)pAVar14->m_target]
                     ,0);
          dVar4 = (*pAVar14->m_ctx->_vptr_Context[0x79])();
          glu::checkError(dVar4,"glBindBuffer()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                          ,0x438);
          pcVar15 = pAVar14->m_data;
        }
        else {
          if (pAVar14->m_storage == STORAGE_BUFFER) {
            (*pAVar14->m_ctx->_vptr_Context[0x25])
                      (pAVar14->m_ctx,
                       (ulong)ContextArray::targetToGL::targets[(int)pAVar14->m_target],
                       (ulong)pAVar14->m_glBuffer);
            dVar4 = (*pAVar14->m_ctx->_vptr_Context[0x79])();
            glu::checkError(dVar4,"glBindBuffer()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                            ,0x431);
          }
          pcVar15 = (char *)0x0;
        }
        uVar6 = (ulong)(int)pAVar14->m_inputType;
        if ((uVar6 < 10) && ((0x207U >> (pAVar14->m_inputType & 0x1f) & 1) != 0)) {
          in_stack_fffffffffffffde8 = pcVar15 + pAVar14->m_offset;
          (*pAVar14->m_ctx->_vptr_Context[0x4e])
                    (pAVar14->m_ctx,(ulong)uVar5,(ulong)(uint)pAVar14->m_componentCount,
                     (ulong)*(uint *)(gls::(anonymous_namespace)::
                                      inputTypeToGL(deqp::gls::DrawTestSpec::InputType)::types +
                                     uVar6 * 4),(ulong)pAVar14->m_normalize,
                     (ulong)(uint)pAVar14->m_stride,in_stack_fffffffffffffde8);
          dVar4 = (*pAVar14->m_ctx->_vptr_Context[0x79])();
          iVar11 = 0x45c;
LAB_0186b2ff:
          pcVar15 = "glVertexAttribPointer()";
        }
        else {
          if (pAVar14->m_outputType < OUTPUTTYPE_INT) {
            uVar13 = 0x80e1;
            if (pAVar14->m_bgraOrder == false) {
              uVar13 = (ulong)(uint)pAVar14->m_componentCount;
            }
            in_stack_fffffffffffffde8 = pcVar15 + pAVar14->m_offset;
            (*pAVar14->m_ctx->_vptr_Context[0x4e])
                      (pAVar14->m_ctx,(ulong)uVar5,uVar13,
                       (ulong)*(uint *)(gls::(anonymous_namespace)::
                                        inputTypeToGL(deqp::gls::DrawTestSpec::InputType)::types +
                                       uVar6 * 4),(ulong)pAVar14->m_normalize,
                       (ulong)(uint)pAVar14->m_stride,in_stack_fffffffffffffde8);
            dVar4 = (*pAVar14->m_ctx->_vptr_Context[0x79])();
            iVar11 = 1099;
            goto LAB_0186b2ff;
          }
          (*pAVar14->m_ctx->_vptr_Context[0x4f])
                    (pAVar14->m_ctx,(ulong)uVar5,(ulong)(uint)pAVar14->m_componentCount,
                     (ulong)*(uint *)(gls::(anonymous_namespace)::
                                      inputTypeToGL(deqp::gls::DrawTestSpec::InputType)::types +
                                     uVar6 * 4),(ulong)(uint)pAVar14->m_stride);
          dVar4 = (*pAVar14->m_ctx->_vptr_Context[0x79])();
          iVar11 = 0x451;
          pcVar15 = "glVertexAttribIPointer()";
        }
        glu::checkError(dVar4,pcVar15,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                        ,iVar11);
        if (pAVar14->m_instanceDivisor != 0) {
          (*pAVar14->m_ctx->_vptr_Context[0x52])(pAVar14->m_ctx,(ulong)uVar5);
        }
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar18 = (undefined4)((ulong)in_stack_fffffffffffffde8 >> 0x20);
      lVar17 = lVar17 + 1;
    } while (lVar17 < (int)((ulong)((long)(this->m_arrays).
                                          super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_arrays).
                                         super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  if (DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX < local_1bc) goto LAB_0186bc78;
  switch(local_1bc) {
  case DRAWMETHOD_DRAWARRAYS:
    (*this->m_ctx->_vptr_Context[0x68])
              (this->m_ctx,
               (ulong)*(uint *)(gls::(anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),firstVertex,(ulong)(uint)vertexCount);
    dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
    pcVar15 = "glDrawArrays()";
    iVar11 = 0x7ad;
    break;
  case DRAWMETHOD_DRAWARRAYS_INSTANCED:
    (*this->m_ctx->_vptr_Context[0x69])
              (this->m_ctx,
               (ulong)*(uint *)(gls::(anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),firstVertex,(ulong)(uint)vertexCount,
               (ulong)(uint)instanceCount);
    dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
    pcVar15 = "glDrawArraysInstanced()";
    iVar11 = 0x7b2;
    break;
  case DRAWMETHOD_DRAWARRAYS_INDIRECT:
    lVar17 = (long)indirectOffset;
    pvVar8 = operator_new__(lVar17 + 0x10U);
    *(int *)((long)pvVar8 + lVar17) = vertexCount;
    *(int *)((long)pvVar8 + lVar17 + 4) = instanceCount;
    *(int *)((long)pvVar8 + lVar17 + 8) = firstVertex;
    *(undefined4 *)((long)pvVar8 + lVar17 + 0xc) = 0;
    if (this->m_logEnabled == true) {
      local_1b8._0_8_ = this->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"DrawArraysIndirectCommand:\n",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tcount: ",8);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tprimCount: ",0xc);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tfirst: ",8);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\treservedMustBeZero: ",0x15);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x68));
    }
    local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffff00000000;
    (*this->m_ctx->_vptr_Context[0x26])(this->m_ctx,1,local_1b8);
    (*this->m_ctx->_vptr_Context[0x25])(this->m_ctx,0x8f3f,local_1b8._0_8_ & 0xffffffff);
    (*this->m_ctx->_vptr_Context[0x28])(this->m_ctx,0x8f3f,lVar17 + 0x10U,pvVar8,0x88e4);
    operator_delete__(pvVar8);
    dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar4,"Setup draw indirect buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x7e9);
    (*this->m_ctx->_vptr_Context[0x70])
              (this->m_ctx,
               (ulong)*(uint *)(gls::(anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),(ulong)(uint)indirectOffset);
    dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar4,"glDrawArraysIndirect()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x7ec);
    pCVar16 = this->m_ctx;
    pp_Var9 = pCVar16->_vptr_Context;
    goto LAB_0186bc10;
  case DRAWMETHOD_DRAWELEMENTS:
    (*this->m_ctx->_vptr_Context[0x6a])
              (this->m_ctx,
               (ulong)*(uint *)(gls::(anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),(ulong)(uint)vertexCount,
               (ulong)*(uint *)(gls::(anonymous_namespace)::
                                indexTypeToGL(deqp::gls::DrawTestSpec::IndexType)::indexTypes +
                               (long)(int)indexType * 4),indexOffset);
    dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
    pcVar15 = "glDrawElements()";
    iVar11 = 0x7b7;
    break;
  case DRAWMETHOD_DRAWELEMENTS_RANGED:
    (*this->m_ctx->_vptr_Context[0x6e])
              (this->m_ctx,
               (ulong)*(uint *)(gls::(anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),(ulong)(uint)rangeStart,
               (ulong)(uint)rangeEnd,(ulong)(uint)vertexCount,
               (ulong)*(uint *)(gls::(anonymous_namespace)::
                                indexTypeToGL(deqp::gls::DrawTestSpec::IndexType)::indexTypes +
                               (long)(int)indexType * 4),indexOffset);
    dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
    pcVar15 = "glDrawRangeElements()";
    iVar11 = 0x7bc;
    break;
  case DRAWMETHOD_DRAWELEMENTS_INSTANCED:
    (*this->m_ctx->_vptr_Context[0x6b])
              (this->m_ctx,
               (ulong)*(uint *)(gls::(anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),(ulong)(uint)vertexCount,
               (ulong)*(uint *)(gls::(anonymous_namespace)::
                                indexTypeToGL(deqp::gls::DrawTestSpec::IndexType)::indexTypes +
                               (long)(int)indexType * 4),indexOffset,(ulong)(uint)instanceCount);
    dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
    pcVar15 = "glDrawElementsInstanced()";
    iVar11 = 0x7c1;
    break;
  case DRAWMETHOD_DRAWELEMENTS_INDIRECT:
    lVar17 = (long)indirectOffset;
    pvVar8 = operator_new__(lVar17 + 0x14U);
    iVar11 = DrawTestSpec::indexTypeSize::size[(int)indexType];
    *(int *)((long)pvVar8 + lVar17) = vertexCount;
    *(int *)((long)pvVar8 + lVar17 + 4) = instanceCount;
    *(int *)((long)pvVar8 + lVar17 + 8) = (int)((long)indexOffset / (long)iVar11);
    *(int *)((long)pvVar8 + lVar17 + 0xc) = baseVertex;
    *(undefined4 *)((long)pvVar8 + lVar17 + 0x10) = 0;
    if (this->m_logEnabled == true) {
      local_1b8._0_8_ = this->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"DrawElementsIndirectCommand:\n",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tcount: ",8);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tprimCount: ",0xc);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tfirstIndex: ",0xd);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tbaseVertex: ",0xd);
      std::ostream::operator<<(poVar1,baseVertex);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\treservedMustBeZero: ",0x15);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x68));
    }
    local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffff00000000;
    (*this->m_ctx->_vptr_Context[0x26])(this->m_ctx,1,local_1b8);
    (*this->m_ctx->_vptr_Context[0x25])(this->m_ctx,0x8f3f,local_1b8._0_8_ & 0xffffffff);
    (*this->m_ctx->_vptr_Context[0x28])(this->m_ctx,0x8f3f,lVar17 + 0x14U,pvVar8,0x88e4);
    operator_delete__(pvVar8);
    dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar4,"Setup draw indirect buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x81c);
    (*this->m_ctx->_vptr_Context[0x71])
              (this->m_ctx,
               (ulong)*(uint *)(gls::(anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),
               (ulong)*(uint *)(gls::(anonymous_namespace)::
                                indexTypeToGL(deqp::gls::DrawTestSpec::IndexType)::indexTypes +
                               (long)(int)indexType * 4),(ulong)(uint)indirectOffset);
    dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar4,"glDrawArraysIndirect()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x81f);
    pCVar16 = this->m_ctx;
    pp_Var9 = pCVar16->_vptr_Context;
LAB_0186bc10:
    (*pp_Var9[0x27])(pCVar16,1,local_1b8);
    goto LAB_0186bc78;
  case DRAWMETHOD_DRAWELEMENTS_BASEVERTEX:
    (*this->m_ctx->_vptr_Context[0x6c])
              (this->m_ctx,
               (ulong)*(uint *)(gls::(anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),(ulong)(uint)vertexCount,
               (ulong)*(uint *)(gls::(anonymous_namespace)::
                                indexTypeToGL(deqp::gls::DrawTestSpec::IndexType)::indexTypes +
                               (long)(int)indexType * 4),indexOffset,(ulong)(uint)baseVertex);
    dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
    pcVar15 = "glDrawElementsBaseVertex()";
    iVar11 = 0x826;
    break;
  case DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX:
    (*this->m_ctx->_vptr_Context[0x6d])
              (this->m_ctx,
               (ulong)*(uint *)(gls::(anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),(ulong)(uint)vertexCount,
               (ulong)*(uint *)(gls::(anonymous_namespace)::
                                indexTypeToGL(deqp::gls::DrawTestSpec::IndexType)::indexTypes +
                               (long)(int)indexType * 4),indexOffset,(ulong)(uint)instanceCount,
               CONCAT44(uVar18,baseVertex));
    dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
    pcVar15 = "glDrawElementsInstancedBaseVertex()";
    iVar11 = 0x82b;
    break;
  case DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX:
    (*this->m_ctx->_vptr_Context[0x6f])
              (this->m_ctx,
               (ulong)*(uint *)(gls::(anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),(ulong)(uint)rangeStart,
               (ulong)(uint)rangeEnd,(ulong)(uint)vertexCount,
               (ulong)*(uint *)(gls::(anonymous_namespace)::
                                indexTypeToGL(deqp::gls::DrawTestSpec::IndexType)::indexTypes +
                               (long)(int)indexType * 4),indexOffset,baseVertex);
    dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
    pcVar15 = "glDrawRangeElementsBaseVertex()";
    iVar11 = 0x830;
  }
  glu::checkError(dVar4,pcVar15,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                  ,iVar11);
LAB_0186bc78:
  ppAVar10 = (this->m_arrays).
             super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppAVar12 = (this->m_arrays).
             super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppAVar12 - (long)ppAVar10) >> 3)) {
    lVar17 = 0;
    do {
      if (ppAVar10[lVar17]->m_bound == true) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"a_",2);
        std::ostream::operator<<((ostream *)local_1a8,(int)lVar17);
        pCVar16 = this->m_ctx;
        uVar5 = this->m_programID;
        std::__cxx11::stringbuf::str();
        uVar5 = (*pCVar16->_vptr_Context[0x59])(pCVar16,(ulong)uVar5,local_1e0);
        if (local_1e0 != local_1d0) {
          operator_delete(local_1e0,local_1d0[0] + 1);
        }
        (*this->m_ctx->_vptr_Context[0x51])(this->m_ctx,(ulong)uVar5);
        dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
        glu::checkError(dVar4,"glDisableVertexAttribArray()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                        ,0x83f);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
        ppAVar10 = (this->m_arrays).
                   super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppAVar12 = (this->m_arrays).
                   super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < (int)((ulong)((long)ppAVar12 - (long)ppAVar10) >> 3));
  }
  if (this->m_useVao != false) {
    (*this->m_ctx->_vptr_Context[0x4b])(this->m_ctx,0);
  }
  (*this->m_ctx->_vptr_Context[0x76])(this->m_ctx,0);
  (*this->m_ctx->_vptr_Context[0x80])
            (this->m_ctx,&this->m_screen,0,0,(ulong)(uint)(this->m_screen).m_width,
             (ulong)(uint)(this->m_screen).m_height);
  return;
}

Assistant:

void AttributePack::render (DrawTestSpec::Primitive primitive, DrawTestSpec::DrawMethod drawMethod, int firstVertex, int vertexCount, DrawTestSpec::IndexType indexType, const void* indexOffset, int rangeStart, int rangeEnd, int instanceCount, int indirectOffset, int baseVertex, float coordScale, float colorScale, AttributeArray* indexArray)
{
	DE_ASSERT(m_program != DE_NULL);
	DE_ASSERT(m_programID != 0);

	m_ctx.viewport(0, 0, m_screen.getWidth(), m_screen.getHeight());
	m_ctx.clearColor(0.0, 0.0, 0.0, 1.0);
	m_ctx.clear(GL_COLOR_BUFFER_BIT);

	m_ctx.useProgram(m_programID);
	GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glUseProgram()");

	m_ctx.uniform1f(m_ctx.getUniformLocation(m_programID, "u_coordScale"), coordScale);
	m_ctx.uniform1f(m_ctx.getUniformLocation(m_programID, "u_colorScale"), colorScale);

	if (m_useVao)
		m_ctx.bindVertexArray(m_vaoID);

	if (indexArray)
		indexArray->bindIndexArray(DrawTestSpec::TARGET_ELEMENT_ARRAY);

	for (int arrayNdx = 0; arrayNdx < (int)m_arrays.size(); arrayNdx++)
	{
		std::stringstream attribName;
		attribName << "a_" << arrayNdx;

		deUint32 loc = m_ctx.getAttribLocation(m_programID, attribName.str().c_str());

		if (m_arrays[arrayNdx]->isBound())
		{
			m_ctx.enableVertexAttribArray(loc);
			GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glEnableVertexAttribArray()");
		}

		m_arrays[arrayNdx]->bindAttribute(loc);
	}

	if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWARRAYS)
	{
		m_ctx.drawArrays(primitiveToGL(primitive), firstVertex, vertexCount);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawArrays()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INSTANCED)
	{
		m_ctx.drawArraysInstanced(primitiveToGL(primitive), firstVertex, vertexCount, instanceCount);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawArraysInstanced()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS)
	{
		m_ctx.drawElements(primitiveToGL(primitive), vertexCount, indexTypeToGL(indexType), indexOffset);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawElements()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED)
	{
		m_ctx.drawRangeElements(primitiveToGL(primitive), rangeStart, rangeEnd, vertexCount, indexTypeToGL(indexType), indexOffset);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawRangeElements()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED)
	{
		m_ctx.drawElementsInstanced(primitiveToGL(primitive), vertexCount, indexTypeToGL(indexType), indexOffset, instanceCount);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawElementsInstanced()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INDIRECT)
	{
		struct DrawCommand
		{
			GLuint count;
			GLuint primCount;
			GLuint first;
			GLuint reservedMustBeZero;
		};
		deUint8* buffer = new deUint8[sizeof(DrawCommand) + indirectOffset];

		{
			DrawCommand command;

			command.count				= vertexCount;
			command.primCount			= instanceCount;
			command.first				= firstVertex;
			command.reservedMustBeZero	= 0;

			memcpy(buffer + indirectOffset, &command, sizeof(command));

			if (m_logEnabled)
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "DrawArraysIndirectCommand:\n"
					<< "\tcount: " << command.count << "\n"
					<< "\tprimCount: " << command.primCount << "\n"
					<< "\tfirst: " << command.first << "\n"
					<< "\treservedMustBeZero: " << command.reservedMustBeZero << "\n"
					<< tcu::TestLog::EndMessage;
		}

		GLuint indirectBuf = 0;
		m_ctx.genBuffers(1, &indirectBuf);
		m_ctx.bindBuffer(GL_DRAW_INDIRECT_BUFFER, indirectBuf);
		m_ctx.bufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawCommand) + indirectOffset, buffer, GL_STATIC_DRAW);
		delete [] buffer;

		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "Setup draw indirect buffer");

		m_ctx.drawArraysIndirect(primitiveToGL(primitive), (const deInt8*)DE_NULL + indirectOffset);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawArraysIndirect()");

		m_ctx.deleteBuffers(1, &indirectBuf);
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INDIRECT)
	{
		struct DrawCommand
		{
			GLuint count;
			GLuint primCount;
			GLuint firstIndex;
			GLint  baseVertex;
			GLuint reservedMustBeZero;
		};
		deUint8* buffer = new deUint8[sizeof(DrawCommand) + indirectOffset];

		{
			DrawCommand command;

			// index offset must be converted to firstIndex by dividing with the index element size
			DE_ASSERT(((const deUint8*)indexOffset - (const deUint8*)DE_NULL) % gls::DrawTestSpec::indexTypeSize(indexType) == 0); // \note This is checked in spec validation

			command.count				= vertexCount;
			command.primCount			= instanceCount;
			command.firstIndex			= (glw::GLuint)(((const deUint8*)indexOffset - (const deUint8*)DE_NULL) / gls::DrawTestSpec::indexTypeSize(indexType));
			command.baseVertex			= baseVertex;
			command.reservedMustBeZero	= 0;

			memcpy(buffer + indirectOffset, &command, sizeof(command));

			if (m_logEnabled)
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "DrawElementsIndirectCommand:\n"
					<< "\tcount: " << command.count << "\n"
					<< "\tprimCount: " << command.primCount << "\n"
					<< "\tfirstIndex: " << command.firstIndex << "\n"
					<< "\tbaseVertex: " << command.baseVertex << "\n"
					<< "\treservedMustBeZero: " << command.reservedMustBeZero << "\n"
					<< tcu::TestLog::EndMessage;
		}

		GLuint indirectBuf = 0;
		m_ctx.genBuffers(1, &indirectBuf);
		m_ctx.bindBuffer(GL_DRAW_INDIRECT_BUFFER, indirectBuf);
		m_ctx.bufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawCommand) + indirectOffset, buffer, GL_STATIC_DRAW);
		delete [] buffer;

		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "Setup draw indirect buffer");

		m_ctx.drawElementsIndirect(primitiveToGL(primitive), indexTypeToGL(indexType), (const deInt8*)DE_NULL + indirectOffset);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawArraysIndirect()");

		m_ctx.deleteBuffers(1, &indirectBuf);
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_BASEVERTEX)
	{
		m_ctx.drawElementsBaseVertex(primitiveToGL(primitive), vertexCount, indexTypeToGL(indexType), indexOffset, baseVertex);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawElementsBaseVertex()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX)
	{
		m_ctx.drawElementsInstancedBaseVertex(primitiveToGL(primitive), vertexCount, indexTypeToGL(indexType), indexOffset, instanceCount, baseVertex);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawElementsInstancedBaseVertex()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX)
	{
		m_ctx.drawRangeElementsBaseVertex(primitiveToGL(primitive), rangeStart, rangeEnd, vertexCount, indexTypeToGL(indexType), indexOffset, baseVertex);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawRangeElementsBaseVertex()");
	}
	else
		DE_ASSERT(DE_FALSE);

	for (int arrayNdx = 0; arrayNdx < (int)m_arrays.size(); arrayNdx++)
	{
		if (m_arrays[arrayNdx]->isBound())
		{
			std::stringstream attribName;
			attribName << "a_" << arrayNdx;

			deUint32 loc = m_ctx.getAttribLocation(m_programID, attribName.str().c_str());

			m_ctx.disableVertexAttribArray(loc);
			GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDisableVertexAttribArray()");
		}
	}

	if (m_useVao)
		m_ctx.bindVertexArray(0);

	m_ctx.useProgram(0);
	m_ctx.readPixels(m_screen, 0, 0, m_screen.getWidth(), m_screen.getHeight());
}